

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_retcode.c
# Opt level: O1

void TA_SetRetCodeInfo(TA_RetCode theRetCode,TA_RetCodeInfo *retCodeInfo)

{
  char *pcVar1;
  long lVar2;
  
  if (theRetCode - TA_INTERNAL_ERROR < 1000) {
    retCodeInfo->enumStr = "TA_INTERNAL_ERROR";
    pcVar1 = "Unexpected Internal Error - Contact TA-Lib.org";
  }
  else {
    lVar2 = 0x10;
    do {
      if (*(TA_RetCode *)((long)&__frame_dummy_init_array_entry + lVar2) == theRetCode) {
        pcVar1 = *(char **)((long)&retCodeInfoTable[0].retCode + lVar2);
        retCodeInfo->enumStr = *(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar2);
        goto LAB_0018bda5;
      }
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x1c0);
    retCodeInfo->enumStr = "TA_UNKNOWN_ERR";
    pcVar1 = "Unknown Error";
  }
LAB_0018bda5:
  retCodeInfo->infoStr = pcVar1;
  return;
}

Assistant:

void TA_SetRetCodeInfo( TA_RetCode theRetCode, TA_RetCodeInfo *retCodeInfo )
{
   unsigned int i;
   
   /* Trap internal error code */
   if( (theRetCode >= 5000) && (theRetCode <= 5999) )
   {
      retCodeInfo->enumStr = "TA_INTERNAL_ERROR";
      retCodeInfo->infoStr = "Unexpected Internal Error - Contact TA-Lib.org";
      return;
   }
   
   /* Check among all the error code defined in ta_common.h */
   for( i=0; i < (NB_RET_CODE_INFO-1); i++ )
   {
      if( theRetCode == retCodeInfoTable[i].retCode )
      {
         /* Error code found. */
         retCodeInfo->enumStr = retCodeInfoTable[i].enumStr;
         retCodeInfo->infoStr = retCodeInfoTable[i].infoStr;
         return;
      }
   }

   /* Error code not found. */

   /* "TA_UNKNOWN_ERR" is ALWAYS the last entry in the table. */
   retCodeInfo->enumStr = retCodeInfoTable[i].enumStr;
   retCodeInfo->infoStr = retCodeInfoTable[i].infoStr;
}